

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool duckdb::StandardNumericToDecimalCast<unsigned_short,long,duckdb::UnsignedToDecimalOperator>
               (unsigned_short input,long *result,CastParameters *parameters,uint8_t width,
               uint8_t scale)

{
  ulong uVar1;
  ulong uVar2;
  undefined7 in_register_00000009;
  undefined6 in_register_0000003a;
  undefined7 in_register_00000081;
  uchar in_R9B;
  ulong uVar3;
  string error;
  allocator local_71;
  Exception local_70 [2];
  string local_50;
  
  uVar2 = CONCAT71(in_register_00000081,scale) & 0xffffffff;
  uVar1 = *(ulong *)(NumericHelper::POWERS_OF_TEN +
                    ((CONCAT71(in_register_00000009,width) & 0xffffffff) - uVar2) * 8);
  uVar3 = CONCAT62(in_register_0000003a,input) & 0xffffffff;
  if (uVar3 < uVar1) {
    *result = *(long *)(NumericHelper::POWERS_OF_TEN + uVar2 * 8) * uVar3;
  }
  else {
    ::std::__cxx11::string::string
              ((string *)local_70,"Could not cast value %d to DECIMAL(%d,%d)",&local_71);
    Exception::ConstructMessage<unsigned_short,unsigned_char,unsigned_char>
              (&local_50,local_70,(string *)(ulong)input,(ushort)width,scale,in_R9B);
    ::std::__cxx11::string::~string((string *)local_70);
    HandleCastError::AssignError(&local_50,parameters);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  return uVar3 < uVar1;
}

Assistant:

bool StandardNumericToDecimalCast(SRC input, DST &result, CastParameters &parameters, uint8_t width, uint8_t scale) {
	// check for overflow
	DST max_width = UnsafeNumericCast<DST>(NumericHelper::POWERS_OF_TEN[width - scale]);
	if (OP::template Operation<SRC, DST>(input, max_width)) {
		string error = StringUtil::Format("Could not cast value %d to DECIMAL(%d,%d)", input, width, scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	result = UnsafeNumericCast<DST>(DST(input) * NumericHelper::POWERS_OF_TEN[scale]);
	return true;
}